

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::TiledRgbaInputFile::~TiledRgbaInputFile(TiledRgbaInputFile *this)

{
  TiledInputFile *this_00;
  FromYa *pFVar1;
  
  this->_vptr_TiledRgbaInputFile = (_func_int **)&PTR__TiledRgbaInputFile_001e4508;
  this_00 = this->_inputFile;
  if (this_00 != (TiledInputFile *)0x0) {
    TiledInputFile::~TiledInputFile(this_00);
  }
  operator_delete(this_00,0x20);
  pFVar1 = this->_fromYa;
  if (pFVar1 != (FromYa *)0x0) {
    Array2D<Imf_3_4::Rgba>::~Array2D(&pFVar1->_buf);
  }
  operator_delete(pFVar1,0x78);
  std::__cxx11::string::~string((string *)&this->_channelNamePrefix);
  return;
}

Assistant:

TiledRgbaInputFile::~TiledRgbaInputFile ()
{
    delete _inputFile;
    delete _fromYa;
}